

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void heightOfSelect(Select *p,int *pnHeight)

{
  int *pnHeight_local;
  Select *p_local;
  
  if (p != (Select *)0x0) {
    heightOfExpr(p->pWhere,pnHeight);
    heightOfExpr(p->pHaving,pnHeight);
    heightOfExpr(p->pLimit,pnHeight);
    heightOfExpr(p->pOffset,pnHeight);
    heightOfExprList(p->pEList,pnHeight);
    heightOfExprList(p->pGroupBy,pnHeight);
    heightOfExprList(p->pOrderBy,pnHeight);
    heightOfSelect(p->pPrior,pnHeight);
  }
  return;
}

Assistant:

static void heightOfSelect(Select *p, int *pnHeight){
  if( p ){
    heightOfExpr(p->pWhere, pnHeight);
    heightOfExpr(p->pHaving, pnHeight);
    heightOfExpr(p->pLimit, pnHeight);
    heightOfExpr(p->pOffset, pnHeight);
    heightOfExprList(p->pEList, pnHeight);
    heightOfExprList(p->pGroupBy, pnHeight);
    heightOfExprList(p->pOrderBy, pnHeight);
    heightOfSelect(p->pPrior, pnHeight);
  }
}